

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionVariable.cpp
# Opt level: O0

Error * __thiscall
stick::ConditionVariable::notifyOne(Error *__return_storage_ptr__,ConditionVariable *this)

{
  SystemErrorCode _code;
  Allocator *_alloc;
  String local_40;
  SystemErrorCode local_1c;
  ConditionVariable *pCStack_18;
  int res;
  ConditionVariable *this_local;
  
  pCStack_18 = this;
  this_local = (ConditionVariable *)__return_storage_ptr__;
  if ((this->m_bIsInitialized & 1U) == 0) {
    Error::Error(__return_storage_ptr__);
  }
  else {
    _code = pthread_cond_signal((pthread_cond_t *)this);
    local_1c = _code;
    if (_code == 0) {
      Error::Error(__return_storage_ptr__);
    }
    else {
      _alloc = defaultAllocator();
      String::String(&local_40,"pthread_cond_signal failed.",_alloc);
      Error::Error<stick::ec::SystemErrorCode>
                (__return_storage_ptr__,_code,&local_40,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/ConditionVariable.cpp"
                 ,0x1a,(type *)0x0);
      String::~String(&local_40);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error ConditionVariable::notifyOne()
{
    if (!m_bIsInitialized)
        return Error();
#ifdef STICK_PLATFORM_UNIX
    int res = pthread_cond_signal(&m_handle);
    if (res != 0)
        return Error(
            ec::SystemErrorCode(res), "pthread_cond_signal failed.", STICK_FILE, STICK_LINE);
    return Error();
#endif // STICK_PLATFORM_UNIX
}